

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O0

lysc_must * lysc_node_musts(lysc_node *node)

{
  lysc_must **pplVar1;
  lysc_must **must_p;
  lysc_node *node_local;
  
  pplVar1 = lysc_node_musts_p(node);
  if (pplVar1 == (lysc_must **)0x0) {
    node_local = (lysc_node *)0x0;
  }
  else {
    node_local = (lysc_node *)*pplVar1;
  }
  return (lysc_must *)node_local;
}

Assistant:

lysc_must *
lysc_node_musts(const struct lysc_node *node)
{
    struct lysc_must **must_p;

    must_p = lysc_node_musts_p(node);
    if (must_p) {
        return *must_p;
    } else {
        return NULL;
    }
}